

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

int __thiscall
amrex::distFcnElement2d::solve_thomas
          (distFcnElement2d *this,vector<double,_std::allocator<double>_> *a,
          vector<double,_std::allocator<double>_> *b,vector<double,_std::allocator<double>_> *c,
          vector<double,_std::allocator<double>_> *d,vector<double,_std::allocator<double>_> *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double dVar8;
  int i_1;
  uint i;
  Real m;
  uint n;
  size_type in_stack_ffffffffffffff68;
  value_type vVar9;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  undefined4 local_48;
  undefined4 local_44;
  
  sVar5 = std::vector<double,_std::allocator<double>_>::size(in_R8);
  uVar4 = (uint)sVar5;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  for (local_44 = 1; local_44 < uVar4; local_44 = local_44 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)(local_44 - 1));
    dVar8 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)(local_44 - 1));
    dVar1 = *pvVar7;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(ulong)(local_44 - 1));
    dVar2 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)local_44);
    *pvVar7 = -(dVar8 / dVar1) * dVar2 + *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(ulong)(local_44 - 1));
    dVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(ulong)local_44);
    *pvVar7 = -(dVar8 / dVar1) * dVar2 + *pvVar7;
  }
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(ulong)(uVar4 - 1));
  vVar9 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)(uVar4 - 1));
  dVar8 = vVar9 / *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(ulong)(uVar4 - 1));
  *pvVar7 = dVar8;
  for (local_48 = uVar4 - 2; -1 < local_48; local_48 = local_48 + -1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_48);
    dVar8 = *pvVar7;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_48);
    dVar1 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)(local_48 + 1));
    dVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_48);
    dVar3 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)local_48);
    *pvVar7 = (-dVar1 * dVar2 + dVar8) / dVar3;
  }
  return 0;
}

Assistant:

int distFcnElement2d::solve_thomas(const std::vector<amrex::Real> &a,
                                   std::vector<amrex::Real> b,
                                   const std::vector<amrex::Real> &c,
                                   std::vector<amrex::Real> d,
                                   std::vector<amrex::Real> &x) {
  unsigned n;
  n = d.size();
  x.resize(n);

  amrex::Real m;
  for (unsigned i=1; i < n; ++i) {
    m = a[i-1]/b[i-1];
    b[i] -= m*c[i-1];
    d[i] -= m*d[i-1];
  }

  x[n-1] = d[n-1] / b[n-1];

  for (int i=n-2; i > -1; --i) {
    x[i] = (d[i]-c[i]*x[i+1])/b[i];
  }

  return 0;
}